

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineResourceSignatureBase.cpp
# Opt level: O0

bool Diligent::PipelineResourcesCompatible(PipelineResourceDesc *lhs,PipelineResourceDesc *rhs)

{
  bool local_19;
  PipelineResourceDesc *rhs_local;
  PipelineResourceDesc *lhs_local;
  
  local_19 = false;
  if ((((lhs->ShaderStages == rhs->ShaderStages) &&
       (local_19 = false, lhs->ArraySize == rhs->ArraySize)) &&
      (local_19 = false, lhs->ResourceType == rhs->ResourceType)) &&
     (local_19 = false, lhs->VarType == rhs->VarType)) {
    local_19 = lhs->Flags == rhs->Flags;
  }
  return local_19;
}

Assistant:

inline bool PipelineResourcesCompatible(const PipelineResourceDesc& lhs, const PipelineResourceDesc& rhs)
{
    // Ignore resource names.
    // clang-format off
    return lhs.ShaderStages == rhs.ShaderStages &&
           lhs.ArraySize    == rhs.ArraySize    &&
           lhs.ResourceType == rhs.ResourceType &&
           lhs.VarType      == rhs.VarType      &&
           lhs.Flags        == rhs.Flags;
    // clang-format on
}